

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poptint.c
# Opt level: O0

char * POPT_next_char(char *str)

{
  char *local_18;
  char *p;
  char *str_local;
  
  local_18 = str;
  do {
    if (*local_18 == '\0') {
      return local_18;
    }
    local_18 = local_18 + 1;
  } while (((int)*local_18 & 0xc0U) == 0x80);
  return local_18;
}

Assistant:

const char *
POPT_next_char (const char *str)
{
    const char *p = str;

    while (*p != '\0') {
	p++;
	if (((unsigned)*p & 0xc0) != (unsigned)0x80)
	    break;
    }
    return p;
}